

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

Interaction * __thiscall
phyr::Sphere::sample(Interaction *__return_storage_ptr__,Sphere *this,Point2f *u,double *pdf)

{
  Transform *pTVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  Point3<double> local_78;
  double local_60;
  Vector3f local_58;
  Point3<double> local_38;
  
  dVar5 = this->radius;
  uniformSampleSphere(&local_58,u);
  local_78.z = local_58.z * dVar5 + 0.0;
  local_78.x = dVar5 * local_58.x + 0.0;
  local_78.y = dVar5 * local_58.y + 0.0;
  (__return_storage_ptr__->pfError).y = 0.0;
  (__return_storage_ptr__->pfError).z = 0.0;
  (__return_storage_ptr__->wo).z = 0.0;
  (__return_storage_ptr__->pfError).x = 0.0;
  (__return_storage_ptr__->wo).x = 0.0;
  (__return_storage_ptr__->wo).y = 0.0;
  (__return_storage_ptr__->n).y = 0.0;
  (__return_storage_ptr__->n).z = 0.0;
  (__return_storage_ptr__->p).z = 0.0;
  (__return_storage_ptr__->n).x = 0.0;
  (__return_storage_ptr__->p).x = 0.0;
  (__return_storage_ptr__->p).y = 0.0;
  pTVar1 = (this->super_Shape).localToWorld;
  dVar5 = (pTVar1->invMat).d[2][2] * local_78.z +
          (pTVar1->invMat).d[0][2] * local_78.x + (pTVar1->invMat).d[1][2] * local_78.y;
  dVar3 = local_78.z * (pTVar1->invMat).d[2][0] +
          local_78.x * (pTVar1->invMat).d[0][0] + (pTVar1->invMat).d[1][0] * local_78.y;
  dVar4 = local_78.z * (pTVar1->invMat).d[2][1] +
          local_78.x * (pTVar1->invMat).d[0][1] + (pTVar1->invMat).d[1][1] * local_78.y;
  dVar2 = dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar2 < 0.0) {
    local_60 = dVar5;
    dVar2 = sqrt(dVar2);
    dVar5 = local_60;
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  (__return_storage_ptr__->n).x = dVar3 * dVar2;
  (__return_storage_ptr__->n).y = dVar4 * dVar2;
  (__return_storage_ptr__->n).z = dVar2 * dVar5;
  if ((this->super_Shape).reverseNormals == true) {
    (__return_storage_ptr__->n).x = -(dVar3 * dVar2);
    (__return_storage_ptr__->n).y = -(dVar4 * dVar2);
    (__return_storage_ptr__->n).z = -(dVar2 * dVar5);
  }
  dVar5 = this->radius;
  dVar2 = local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar5 = dVar5 / dVar2;
  local_78.x = dVar5 * local_78.x;
  local_78.y = dVar5 * local_78.y;
  local_78.z = dVar5 * local_78.z;
  local_58.z = ABS(local_78.z) * 5.551115123125786e-16;
  local_58.x = ABS(local_78.x) * 5.551115123125786e-16;
  local_58.y = ABS(local_78.y) * 5.551115123125786e-16;
  Transform::operator()
            (&local_38,(this->super_Shape).localToWorld,&local_78,&local_58,
             &__return_storage_ptr__->pfError);
  (__return_storage_ptr__->p).z = local_38.z;
  (__return_storage_ptr__->p).x = local_38.x;
  (__return_storage_ptr__->p).y = local_38.y;
  (*(this->super_Shape)._vptr_Shape[4])(this);
  *pdf = 1.0 / extraout_XMM0_Qa;
  return __return_storage_ptr__;
}

Assistant:

Interaction Sphere::sample(const Point2f& u, Real* pdf) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * uniformSampleSphere(u);
    Interaction it;

    it.n = normalize((*localToWorld)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseNormals) it.n *= -1;

    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * abs((Vector3f)pObj);
    it.p = (*localToWorld)(pObj, pObjError, &it.pfError);
    *pdf = 1 / surfaceArea();

    return it;
}